

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O3

void __thiscall QGraphicsWidget::setWindowFrameMargins(QGraphicsWidget *this,QMarginsF margins)

{
  QGraphicsWidgetPrivate *this_00;
  QMarginsF *pQVar1;
  bool bVar2;
  ulong uVar3;
  
  this_00 = *(QGraphicsWidgetPrivate **)(this + 0x18);
  if (((((this_00->windowFrameMargins)._M_t.
         super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
         super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
         super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl != (QMarginsF *)0x0) ||
       (uVar3 = -(ulong)(margins.m_left < -margins.m_left),
       1e-12 < (double)(~uVar3 & (ulong)margins.m_left | (ulong)-margins.m_left & uVar3))) ||
      (uVar3 = -(ulong)(margins.m_top < -margins.m_top),
      1e-12 < (double)(~uVar3 & (ulong)margins.m_top | (ulong)-margins.m_top & uVar3))) ||
     ((uVar3 = -(ulong)(margins.m_right < -margins.m_right),
      1e-12 < (double)(~uVar3 & (ulong)margins.m_right | (ulong)-margins.m_right & uVar3) ||
      (uVar3 = -(ulong)(margins.m_bottom < -margins.m_bottom),
      1e-12 < (double)(~uVar3 & (ulong)margins.m_bottom | (ulong)-margins.m_bottom & uVar3))))) {
    QGraphicsWidgetPrivate::ensureWindowFrameMargins(this_00);
    pQVar1 = (this_00->windowFrameMargins)._M_t.
             super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
             super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
             super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
    if (pQVar1 == (QMarginsF *)0x0) {
      setWindowFrameMargins();
LAB_0063ae97:
      setWindowFrameMargins();
    }
    bVar2 = qFuzzyCompare(pQVar1,&margins);
    if ((!bVar2) || (this_00->setWindowFrameMargins == false)) {
      if (!bVar2) {
        QGraphicsItem::prepareGeometryChange((QGraphicsItem *)(this + 0x10));
      }
      pQVar1 = (this_00->windowFrameMargins)._M_t.
               super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
               super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
               super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
      if (pQVar1 == (QMarginsF *)0x0) goto LAB_0063ae97;
      pQVar1->m_right = margins.m_right;
      pQVar1->m_bottom = margins.m_bottom;
      pQVar1->m_left = margins.m_left;
      pQVar1->m_top = margins.m_top;
      this_00->setWindowFrameMargins = true;
    }
  }
  return;
}

Assistant:

void QGraphicsWidget::setWindowFrameMargins(QMarginsF margins)
{
    Q_D(QGraphicsWidget);

    if (!d->windowFrameMargins && margins.isNull())
        return;
    d->ensureWindowFrameMargins();
    const bool unchanged = *d->windowFrameMargins == margins;
    if (d->setWindowFrameMargins && unchanged)
        return;
    if (!unchanged)
        prepareGeometryChange();
    *d->windowFrameMargins = margins;
    d->setWindowFrameMargins = true;
}